

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction_X86.h
# Opt level: O0

void __thiscall x86Argument::x86Argument(x86Argument *this)

{
  x86Argument *this_local;
  
  this->type = argNone;
  (this->field_1).imm64Arg = 0;
  this->ptrBase = rNONE;
  this->ptrIndex = rNONE;
  this->ptrMult = 0;
  this->ptrNum = 0;
  return;
}

Assistant:

x86Argument()
	{
		this->type = argNone;
		this->imm64Arg = 0;
		this->ptrBase = rNONE;
		this->ptrIndex = rNONE;
		this->ptrMult = 0;
		this->ptrNum = 0;
	}